

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockVarSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClockVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&,slang::ast::ClockingSkew&,slang::ast::ClockingSkew&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,ArgumentDirection *args_2,ClockingSkew *args_3,ClockingSkew *args_4
          )

{
  ClockingSkew outputSkew;
  ClockVarSymbol *pCVar1;
  ClockingSkew *in_RSI;
  TimingControl *in_R8;
  undefined8 *in_R9;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  pCVar1 = (ClockVarSymbol *)
           allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  outputSkew.delay = in_R8;
  outputSkew._0_8_ = in_R9;
  ast::ClockVarSymbol::ClockVarSymbol
            ((ClockVarSymbol *)*in_R9,*(string_view *)in_R8,*(SourceLocation *)(in_R9 + 1),
             (ArgumentDirection)((ulong)pCVar1 >> 0x20),*in_RSI,outputSkew);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }